

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

CustomExternalWrapperObject *
Js::CustomExternalWrapperObject::Create
          (void *data,uint inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsGetterSetterInterceptor **getterSetterInterceptor,
          RecyclableObject *prototype,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptLibrary *pJVar4;
  Recycler *pRVar5;
  CustomExternalWrapperType *this;
  JsGetterSetterInterceptor *pJVar6;
  JsGetterSetterInterceptor *pJVar7;
  undefined4 *puVar8;
  CustomExternalWrapperObject *pCVar9;
  TrackAllocData local_118;
  code *local_f0;
  undefined8 local_e8;
  TrackAllocData local_e0;
  code *local_b8;
  undefined8 local_b0;
  TrackAllocData local_a8;
  CustomExternalWrapperObject *local_80;
  CustomExternalWrapperObject *externalObject;
  undefined8 local_70;
  TrackAllocData local_68;
  CustomExternalWrapperType *local_40;
  DynamicType *dynamicType;
  RecyclableObject *prototype_local;
  JsGetterSetterInterceptor **getterSetterInterceptor_local;
  JsFinalizeCallback finalizeCallback_local;
  JsTraceCallback traceCallback_local;
  void *pvStack_10;
  uint inlineSlotSize_local;
  void *data_local;
  
  dynamicType = (DynamicType *)prototype;
  prototype_local = (RecyclableObject *)getterSetterInterceptor;
  getterSetterInterceptor_local = (JsGetterSetterInterceptor **)finalizeCallback;
  finalizeCallback_local = traceCallback;
  traceCallback_local._4_4_ = inlineSlotSize;
  pvStack_10 = data;
  if (prototype == (RecyclableObject *)0x0) {
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    dynamicType = (DynamicType *)
                  JavascriptLibraryBase::GetObjectPrototype(&pJVar4->super_JavascriptLibraryBase);
  }
  pJVar4 = ScriptContext::GetLibrary(scriptContext);
  local_40 = (CustomExternalWrapperType *)
             JavascriptLibrary::GetCachedCustomExternalWrapperType
                       (pJVar4,(uintptr_t)finalizeCallback_local,
                        (uintptr_t)getterSetterInterceptor_local,
                        (uintptr_t)
                        (prototype_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject,(uintptr_t)dynamicType);
  if (local_40 == (CustomExternalWrapperType *)0x0) {
    pRVar5 = ScriptContext::GetRecycler(scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,(type_info *)&CustomExternalWrapperType::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
               ,0x4f);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_68);
    externalObject = (CustomExternalWrapperObject *)Memory::Recycler::AllocInlined;
    local_70 = 0;
    this = (CustomExternalWrapperType *)new<Memory::Recycler>(0x50,pRVar5,0x43c4b0);
    CustomExternalWrapperType::CustomExternalWrapperType
              (this,scriptContext,finalizeCallback_local,
               (JsFinalizeCallback)getterSetterInterceptor_local,(RecyclableObject *)dynamicType);
    local_40 = this;
    pJVar6 = CustomExternalWrapperType::GetJsGetterSetterInterceptor(this);
    (prototype_local->super_FinalizableObject).super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject = (_func_int **)pJVar6;
    pJVar4 = ScriptContext::GetLibrary(scriptContext);
    JavascriptLibrary::CacheCustomExternalWrapperType
              (pJVar4,(uintptr_t)finalizeCallback_local,(uintptr_t)getterSetterInterceptor_local,
               (uintptr_t)
               (prototype_local->super_FinalizableObject).super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject,(uintptr_t)dynamicType,&local_40->super_DynamicType);
  }
  else if ((prototype_local->super_FinalizableObject).super_IRecyclerVisitedObject.
           _vptr_IRecyclerVisitedObject == (_func_int **)0x0) {
    pJVar6 = CustomExternalWrapperType::GetJsGetterSetterInterceptor(local_40);
    (prototype_local->super_FinalizableObject).super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject = (_func_int **)pJVar6;
  }
  else {
    pJVar6 = (JsGetterSetterInterceptor *)
             (prototype_local->super_FinalizableObject).super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject;
    pJVar7 = CustomExternalWrapperType::GetJsGetterSetterInterceptor(local_40);
    if (pJVar6 != pJVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                  ,0x5b,
                                  "(*getterSetterInterceptor == reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor())"
                                  ,
                                  "*getterSetterInterceptor == reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  BVar3 = Js::Type::IsJsrtExternal((Type *)local_40);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x5f,"(dynamicType->IsJsrtExternal())",
                                "dynamicType->IsJsrtExternal()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (finalizeCallback_local == (JsFinalizeCallback)0x0) {
    if (getterSetterInterceptor_local == (JsGetterSetterInterceptor **)0x0) {
      pRVar5 = ScriptContext::GetRecycler(scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_118,(type_info *)&typeinfo,(ulong)traceCallback_local._4_4_,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                 ,0x6c);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_118);
      pCVar9 = (CustomExternalWrapperObject *)new<Memory::Recycler>(0x30,pRVar5,0x446fd0,0);
      CustomExternalWrapperObject(pCVar9,local_40,pvStack_10,traceCallback_local._4_4_);
      local_80 = pCVar9;
    }
    else {
      pRVar5 = ScriptContext::GetRecycler(scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_e0,(type_info *)&typeinfo,(ulong)traceCallback_local._4_4_,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                 ,0x68);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_e0);
      local_f0 = Memory::Recycler::AllocFinalized;
      local_e8 = 0;
      pCVar9 = (CustomExternalWrapperObject *)new<Memory::Recycler>(0x30,pRVar5,0x48f150,0);
      CustomExternalWrapperObject(pCVar9,local_40,pvStack_10,traceCallback_local._4_4_);
      local_80 = pCVar9;
    }
  }
  else {
    pRVar5 = ScriptContext::GetRecycler(scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_a8,(type_info *)&typeinfo,(ulong)traceCallback_local._4_4_,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
               ,100);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_a8);
    local_b8 = Memory::Recycler::AllocTracked;
    local_b0 = 0;
    pCVar9 = (CustomExternalWrapperObject *)new<Memory::Recycler>(0x30,pRVar5,0x48f120,0);
    CustomExternalWrapperObject(pCVar9,local_40,pvStack_10,traceCallback_local._4_4_);
    local_80 = pCVar9;
  }
  return local_80;
}

Assistant:

CustomExternalWrapperObject* CustomExternalWrapperObject::Create(void *data, uint inlineSlotSize, JsTraceCallback traceCallback, JsFinalizeCallback finalizeCallback, JsGetterSetterInterceptor ** getterSetterInterceptor, Js::RecyclableObject * prototype, Js::ScriptContext *scriptContext)
{
    if (prototype == nullptr)
    {
        prototype = scriptContext->GetLibrary()->GetObjectPrototype();
    }

    Js::DynamicType * dynamicType = scriptContext->GetLibrary()->GetCachedCustomExternalWrapperType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(*getterSetterInterceptor), reinterpret_cast<uintptr_t>(prototype));
    if (dynamicType == nullptr)
    {
        dynamicType = RecyclerNew(scriptContext->GetRecycler(), CustomExternalWrapperType, scriptContext, traceCallback, finalizeCallback, prototype);
        *getterSetterInterceptor = reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor();
        scriptContext->GetLibrary()->CacheCustomExternalWrapperType(reinterpret_cast<uintptr_t>(traceCallback), reinterpret_cast<uintptr_t>(finalizeCallback), reinterpret_cast<uintptr_t>(*getterSetterInterceptor), reinterpret_cast<uintptr_t>(prototype), dynamicType);
    }
    else
    {
        if (*getterSetterInterceptor == nullptr)
        {
            *getterSetterInterceptor = reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor();
        }
        else
        {
            Assert(*getterSetterInterceptor == reinterpret_cast<CustomExternalWrapperType *>(dynamicType)->GetJsGetterSetterInterceptor());
        }
    }

    Assert(dynamicType->IsJsrtExternal());

    CustomExternalWrapperObject * externalObject;
    if (traceCallback != nullptr)
    {
        externalObject = RecyclerNewTrackedPlus(scriptContext->GetRecycler(), inlineSlotSize, CustomExternalWrapperObject, static_cast<CustomExternalWrapperType*>(dynamicType), data, inlineSlotSize);
    }
    else if (finalizeCallback != nullptr)
    {
        externalObject = RecyclerNewFinalizedPlus(scriptContext->GetRecycler(), inlineSlotSize, CustomExternalWrapperObject, static_cast<CustomExternalWrapperType*>(dynamicType), data, inlineSlotSize);
    }
    else
    {
        externalObject = RecyclerNewPlus(scriptContext->GetRecycler(), inlineSlotSize, CustomExternalWrapperObject, static_cast<CustomExternalWrapperType*>(dynamicType), data, inlineSlotSize);
    }

    return externalObject;
}